

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::TextToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type,size_t offset)

{
  char *pcVar1;
  char *pcVar2;
  Location loc;
  char *pcVar3;
  int iVar4;
  int iVar5;
  string_view text;
  undefined4 uStack_24;
  
  iVar4 = ((int)this->token_start_ - *(int *)&this->line_start_) + 1;
  if (iVar4 < 2) {
    iVar4 = 1;
  }
  pcVar1 = this->cursor_;
  iVar5 = ((int)pcVar1 - *(int *)&this->line_start_) + 1;
  if (iVar5 < 2) {
    iVar5 = 1;
  }
  pcVar3 = this->token_start_ + offset;
  pcVar2 = pcVar1 + -(long)pcVar3;
  if (this->buffer_end_ <= pcVar3 || (pcVar1 < pcVar3 || pcVar1 + -(long)pcVar3 == (char *)0x0)) {
    pcVar3 = (char *)0x0;
    pcVar2 = (char *)0x0;
  }
  loc.field_1.field_0.first_column = iVar4;
  loc.field_1.field_0.line = this->line_;
  loc.field_1._12_4_ = uStack_24;
  loc.field_1.field_0.last_column = iVar5;
  loc.filename._M_str = (this->filename_)._M_dataplus._M_p;
  loc.filename._M_len = (this->filename_)._M_string_length;
  text._M_str = pcVar3;
  text._M_len = (size_t)pcVar2;
  Token::Token(__return_storage_ptr__,loc,token_type,text);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::TextToken(TokenType token_type, size_t offset) {
  return Token(GetLocation(), token_type, GetText(offset));
}